

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O3

Am_Text_Style_Run * __thiscall
Am_Rich_Text_Data::Get_Style_Run_At(Am_Rich_Text_Data *this,Am_Text_Index inIndex)

{
  Am_Text_Style_Run *pAVar1;
  ulong uVar2;
  
  pAVar1 = this->mHeadStyle;
  if (pAVar1 != (Am_Text_Style_Run *)0x0) {
    uVar2 = 0;
    do {
      uVar2 = uVar2 + pAVar1->mCharsInRun;
      if (inIndex <= uVar2) {
        return pAVar1;
      }
      pAVar1 = pAVar1->mNext;
    } while (pAVar1 != (Am_Text_Style_Run *)0x0);
  }
  return (Am_Text_Style_Run *)0x0;
}

Assistant:

Am_Text_Style_Run *
Am_Rich_Text_Data::Get_Style_Run_At(const Am_Text_Index inIndex) const
{
  Am_Text_Index endOfRun = 0;
  Am_Text_Style_Run *sr = mHeadStyle;

  while (sr != nullptr) {
    endOfRun += sr->Length();
    if (inIndex <= endOfRun)
      break;
    sr = sr->Next();
  }
  return sr;
}